

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QWidget * __thiscall QWidgetPrivate::deepestFocusProxy(QWidgetPrivate *this)

{
  QWidget *pQVar1;
  QWidgetPrivate *in_RDI;
  QWidget *nextFocusProxy;
  QWidget *focusProxy;
  QWidget *q;
  QWidget *in_stack_ffffffffffffffe0;
  QWidget *local_8;
  
  q_func(in_RDI);
  pQVar1 = QWidget::focusProxy(in_stack_ffffffffffffffe0);
  if (pQVar1 == (QWidget *)0x0) {
    local_8 = (QWidget *)0x0;
  }
  else {
    do {
      local_8 = pQVar1;
      pQVar1 = QWidget::focusProxy(local_8);
    } while (pQVar1 != (QWidget *)0x0);
  }
  return local_8;
}

Assistant:

QWidget *QWidgetPrivate::deepestFocusProxy() const
{
    Q_Q(const QWidget);

    QWidget *focusProxy = q->focusProxy();
    if (!focusProxy)
        return nullptr;

    while (QWidget *nextFocusProxy = focusProxy->focusProxy())
        focusProxy = nextFocusProxy;

    return focusProxy;
}